

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O0

int Base64Test_EncodeBlock_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<Base64Test> *this_01;
  TestMetaFactoryBase<Base64TestVector> *meta_factory;
  allocator<char> local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  CodeLocation local_68;
  allocator<char> local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Base64Test",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64_test.cc"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0x8f);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<Base64Test>
                      (this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<Base64TestVector> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<Base64Test_EncodeBlock_Test>::TestMetaFactory
            ((TestMetaFactory<Base64Test_EncodeBlock_Test> *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64_test.cc"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0x8f);
  testing::internal::ParameterizedTestSuiteInfo<Base64Test>::AddTestPattern
            (this_01,"Base64Test","EncodeBlock",meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  return 0;
}

Assistant:

TEST_P(Base64Test, EncodeBlock) {
  const Base64TestVector &t = GetParam();
  if (t.relation != canonical) {
    return;
  }

  const size_t decoded_len = strlen(t.decoded);
  size_t max_encoded_len;
  ASSERT_TRUE(EVP_EncodedLength(&max_encoded_len, decoded_len));

  std::vector<uint8_t> out_vec(max_encoded_len);
  uint8_t *out = out_vec.data();
  size_t len = EVP_EncodeBlock(out, (const uint8_t *)t.decoded, decoded_len);

  std::string encoded(RemoveNewlines(t.encoded));
  EXPECT_EQ(Bytes(encoded), Bytes(out, len));
}